

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void printBasisSGDInfo(ktx_uint8_t *bgd,ktx_uint64_t byteLength,ktx_uint32_t numImages)

{
  uint in_EDX;
  ulong in_RSI;
  ushort *in_RDI;
  ktx_uint32_t i;
  ktxBasisLzEtc1sImageDesc *slices;
  ktxBasisLzGlobalHeader *bgdh;
  uint local_2c;
  
  if (0x13 < in_RSI) {
    fprintf(_stdout,"endpointCount: %u\n",(ulong)*in_RDI);
    fprintf(_stdout,"selectorCount: %u\n",(ulong)in_RDI[1]);
    fprintf(_stdout,"endpointsByteLength: %u\n",(ulong)*(uint *)(in_RDI + 2));
    fprintf(_stdout,"selectorsByteLength: %u\n",(ulong)*(uint *)(in_RDI + 4));
    fprintf(_stdout,"tablesByteLength: %u\n",(ulong)*(uint *)(in_RDI + 6));
    fprintf(_stdout,"extendedByteLength: %u\n",(ulong)*(uint *)(in_RDI + 8));
    local_2c = 0;
    while ((local_2c < in_EDX && ((ulong)(local_2c + 1) * 0x14 + 0x14 <= in_RSI))) {
      fprintf(_stdout,"\nimageFlags: %#x\n",(ulong)*(uint *)(in_RDI + (ulong)local_2c * 10 + 10));
      fprintf(_stdout,"rgbSliceByteLength: %u\n",
              (ulong)*(uint *)(in_RDI + (ulong)local_2c * 10 + 0xe));
      fprintf(_stdout,"rgbSliceByteOffset: %#x\n",
              (ulong)*(uint *)(in_RDI + (ulong)local_2c * 10 + 0xc));
      fprintf(_stdout,"alphaSliceByteLength: %u\n",
              (ulong)*(uint *)(in_RDI + (ulong)local_2c * 10 + 0x12));
      fprintf(_stdout,"alphaSliceByteOffset: %#x\n",
              (ulong)*(uint *)(in_RDI + (ulong)local_2c * 10 + 0x10));
      local_2c = local_2c + 1;
    }
  }
  return;
}

Assistant:

void
printBasisSGDInfo(ktx_uint8_t* bgd, ktx_uint64_t byteLength,
                ktx_uint32_t numImages)
{
    ktxBasisLzGlobalHeader* bgdh = (ktxBasisLzGlobalHeader*)(bgd);
    if (byteLength < sizeof(ktxBasisLzGlobalHeader))
        return;

    fprintf(stdout, "endpointCount: %u\n", bgdh->endpointCount);
    fprintf(stdout, "selectorCount: %u\n", bgdh->selectorCount);
    fprintf(stdout, "endpointsByteLength: %u\n", bgdh->endpointsByteLength);
    fprintf(stdout, "selectorsByteLength: %u\n", bgdh->selectorsByteLength);
    fprintf(stdout, "tablesByteLength: %u\n", bgdh->tablesByteLength);
    fprintf(stdout, "extendedByteLength: %u\n", bgdh->extendedByteLength);

    ktxBasisLzEtc1sImageDesc* slices = (ktxBasisLzEtc1sImageDesc*)(bgd + sizeof(ktxBasisLzGlobalHeader));
    for (ktx_uint32_t i = 0; i < numImages; i++) {
        if (byteLength < (i + 1) * sizeof(ktxBasisLzEtc1sImageDesc) + sizeof(ktxBasisLzGlobalHeader))
            break;

        fprintf(stdout, "\nimageFlags: %#x\n", slices[i].imageFlags);
        fprintf(stdout, "rgbSliceByteLength: %u\n", slices[i].rgbSliceByteLength);
        fprintf(stdout, "rgbSliceByteOffset: %#x\n", slices[i].rgbSliceByteOffset);
        fprintf(stdout, "alphaSliceByteLength: %u\n", slices[i].alphaSliceByteLength);
        fprintf(stdout, "alphaSliceByteOffset: %#x\n", slices[i].alphaSliceByteOffset);
    }
}